

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

void __thiscall xemmai::ast::t_block::f_next(t_block *this,t_block *a_next)

{
  pointer *ppptVar1;
  iterator __position;
  t_block *local_20;
  t_block *local_18;
  
  local_20 = a_next;
  local_18 = this;
  std::vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>>::
  emplace_back<xemmai::ast::t_block*>
            ((vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>> *)
             &a_next->v_previouses,&local_18);
  __position._M_current =
       (this->v_nexts).
       super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->v_nexts).
      super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>>::
    _M_realloc_insert<xemmai::ast::t_block*const&>
              ((vector<xemmai::ast::t_block*,std::allocator<xemmai::ast::t_block*>> *)&this->v_nexts
               ,__position,&local_20);
  }
  else {
    *__position._M_current = a_next;
    ppptVar1 = &(this->v_nexts).
                super__Vector_base<xemmai::ast::t_block_*,_std::allocator<xemmai::ast::t_block_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *ppptVar1 = *ppptVar1 + 1;
  }
  return;
}

Assistant:

void f_next(t_block* a_next)
	{
		a_next->v_previouses.push_back(this);
		v_nexts.push_back(a_next);
	}